

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O1

void keepdogs(int exclude,char *pet_msg_suffix)

{
  uint uVar1;
  monst *pmVar2;
  bool bVar3;
  monst *mon;
  boolean bVar4;
  xchar tolev;
  int iVar5;
  char *line;
  char *pcVar6;
  uchar uVar7;
  obj *obj;
  
  pmVar2 = level->monlist;
joined_r0x00172c40:
  do {
    while( true ) {
      do {
        mon = pmVar2;
        if (mon == (monst *)0x0) {
          return;
        }
        pmVar2 = mon->nmon;
      } while ((mon->mhp < 1) || ((exclude == 1 && (mon->mtame == '\0'))));
      bVar4 = monnear(mon,(int)u.ux,(int)u.uy);
      if (((((bVar4 == '\0') || (bVar4 = levl_follower(mon), bVar4 == '\0')) &&
           ((mon != u.usteed && (((u.uhave._0_1_ & 1) == 0 || ((mon->field_0x63 & 0x20) == 0))))))
          || (((*(uint *)&mon->field_0x60 & 0xc0000) != 0x40000 && (mon != u.usteed)))) ||
         ((mon->mstrategy & 0x20000000) != 0)) break;
      if ((mon->mtame == '\0') || (mon->meating == 0)) {
        if ((exclude == 2) && (mon->mtame != '\0')) {
          if (pet_msg_suffix == (char *)0x0) {
            pet_msg_suffix = "remains behind.";
          }
          pcVar6 = Monnam(mon);
          bVar3 = false;
          pline("%s %s",pcVar6,pet_msg_suffix);
        }
        else {
          iVar5 = mon_has_amulet(mon);
          if (iVar5 == 0) {
            bVar3 = true;
            if ((mon->mtame == '\0') || ((mon->field_0x62 & 0x80) == 0)) goto LAB_001731bf;
            if (mon->wormno == '\0') {
              if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
                if ((((u.uprops[0x1e].intrinsic != 0) ||
                     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                      (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                    ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                   ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                    (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_001731bc;
                bVar3 = false;
                if (((viz_array[mon->my][mon->mx] & 1U) == 0) || ((mon->data->mflags3 & 0x200) == 0)
                   ) goto LAB_001731bf;
              }
            }
            else {
              bVar4 = worm_known(level,mon);
              if (bVar4 == '\0') goto LAB_001731bc;
            }
            uVar1 = *(uint *)&mon->field_0x60;
            if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar1 & 0x280) != 0) goto LAB_001731bc;
            }
            else {
              bVar3 = false;
              if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
              goto LAB_001731bf;
            }
            if ((u._1052_1_ & 0x20) != 0) goto LAB_001731bc;
            pcVar6 = Monnam(mon);
            line = "%s is still trapped.";
          }
          else {
            if (mon->wormno == '\0') {
              if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
                if (((((u.uprops[0x1e].intrinsic != 0) ||
                      ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                     (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                    ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                   ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                    (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_001731bc;
                bVar3 = false;
                if (((viz_array[mon->my][mon->mx] & 1U) == 0) || ((mon->data->mflags3 & 0x200) == 0)
                   ) goto LAB_001731bf;
              }
            }
            else {
              bVar4 = worm_known(level,mon);
              if (bVar4 == '\0') goto LAB_001731bc;
            }
            uVar1 = *(uint *)&mon->field_0x60;
            if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar1 & 0x280) != 0) goto LAB_001731bc;
            }
            else {
              bVar3 = false;
              if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
              goto LAB_001731bf;
            }
            if ((u._1052_1_ & 0x20) != 0) goto LAB_001731bc;
            pcVar6 = Monnam(mon);
            line = "%s seems very disoriented for a moment.";
          }
LAB_001730e4:
          bVar3 = false;
          pline(line,pcVar6);
        }
      }
      else {
        if (mon->wormno == '\0') {
          if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
            if (((((u.uprops[0x1e].intrinsic != 0) ||
                  ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
               ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
                (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_001731bc;
            bVar3 = false;
            if (((viz_array[mon->my][mon->mx] & 1U) == 0) || ((mon->data->mflags3 & 0x200) == 0))
            goto LAB_001731bf;
          }
LAB_00172f40:
          uVar1 = *(uint *)&mon->field_0x60;
          if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar1 & 0x280) != 0) goto LAB_001731bc;
          }
          else {
            bVar3 = false;
            if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
            goto LAB_001731bf;
          }
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar6 = Monnam(mon);
            line = "%s is still eating.";
            goto LAB_001730e4;
          }
        }
        else {
          bVar4 = worm_known(level,mon);
          if (bVar4 != '\0') goto LAB_00172f40;
        }
LAB_001731bc:
        bVar3 = false;
      }
LAB_001731bf:
      if ((bVar3) || (mon == u.usteed)) {
        if ((*(uint *)&mon->field_0x60 >> 0x19 & 1) != 0) {
          set_residency(mon,'\x01');
        }
        if (mon->wormno == '\0') {
          uVar7 = '\0';
        }
        else {
          iVar5 = count_wsegs(mon);
          if (0x1e < iVar5) {
            iVar5 = 0x1f;
          }
          uVar7 = (uchar)iVar5;
          wormgone(mon);
        }
        for (obj = mon->minvent; obj != (obj *)0x0; obj = obj->nobj) {
          if (obj->cobj != (obj *)0x0) {
            picked_container(obj);
          }
          obj->field_0x4a = obj->field_0x4a & 0xf7;
        }
        relmon(mon);
        newsym((int)mon->mx,(int)mon->my);
        mon->mx = '\0';
        mon->my = '\0';
        mon->wormno = uVar7;
        mon->mlstmv = moves;
        mon->nmon = mydogs;
        mydogs = mon;
      }
      else if ((*(uint *)&mon->field_0x60 >> 0x18 & 1) != 0) {
        pcVar6 = "%s leash suddenly comes loose.";
LAB_00172d3b:
        pline(pcVar6);
        m_unleash(mon,'\0');
      }
    }
    if ((*(uint *)&mon->field_0x60 >> 0x1d & 1) == 0) {
      if ((*(uint *)&mon->field_0x60 >> 0x18 & 1) != 0) {
        pcVar6 = Monnam(mon);
        s_suffix(pcVar6);
        pcVar6 = "%s leash goes slack.";
        goto LAB_00172d3b;
      }
      goto joined_r0x00172c40;
    }
    tolev = ledger_no(&u.uz);
    migrate_to_level(mon,tolev,'\x02',(coord *)0x0);
  } while( true );
}

Assistant:

void keepdogs(int exclude, const char *pet_msg_suffix)
{
	struct monst *mtmp, *mtmp2;
	struct obj *obj;
	int num_segs;
	boolean stay_behind;
	boolean pets_only = (exclude == 1) ? TRUE : FALSE;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;
	    if (DEADMONSTER(mtmp)) continue;
	    if (pets_only && !mtmp->mtame) continue;
	    if (((monnear(mtmp, u.ux, u.uy) && levl_follower(mtmp)) ||
			(mtmp == u.usteed) ||
		/* the wiz will level t-port from anywhere to chase
		   the amulet; if you don't have it, will chase you
		   only if in range. -3. */
			(u.uhave.amulet && mtmp->iswiz))
		&& ((!mtmp->msleeping && mtmp->mcanmove)
		    /* eg if level teleport or new trap, steed has no control
		       to avoid following */
		    || (mtmp == u.usteed))
		/* monster won't follow if it hasn't noticed you yet */
		&& !(mtmp->mstrategy & STRAT_WAITFORU)) {
		stay_behind = FALSE;
		if (mtmp->mtame && mtmp->meating) {
			if (canseemon(level, mtmp))
			    pline("%s is still eating.", Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && exclude == 2) {
			if (pet_msg_suffix == NULL)
			    pet_msg_suffix = "remains behind.";
			pline("%s %s", Monnam(mtmp), pet_msg_suffix);
			stay_behind = TRUE;
		} else if (mon_has_amulet(mtmp)) {
			if (canseemon(level, mtmp))
			    pline("%s seems very disoriented for a moment.",
				Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && mtmp->mtrapped) {
			if (canseemon(level, mtmp))
			    pline("%s is still trapped.", Monnam(mtmp));
			stay_behind = TRUE;
		}
		if (mtmp == u.usteed)
			stay_behind = FALSE;
		
		if (stay_behind) {
			if (mtmp->mleashed) {
				pline("%s leash suddenly comes loose.",
					humanoid(mtmp->data)
					    ? (mtmp->female ? "Her" : "His")
					    : "Its");
				m_unleash(mtmp, FALSE);
			}
			continue;
		}
		if (mtmp->isshk)
			set_residency(mtmp, TRUE);

		if (mtmp->wormno) {
		    int cnt;
		    /* NOTE: worm is truncated to # segs = max wormno size */
		    cnt = count_wsegs(mtmp);
		    num_segs = min(cnt, MAX_NUM_WORMS - 1);
		    wormgone(mtmp);
		} else num_segs = 0;

		/* set minvent's obj->no_charge to 0 */
		for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    obj->no_charge = 0;
		}

		relmon(mtmp);
		newsym(mtmp->mx,mtmp->my);
		mtmp->mx = mtmp->my = 0; /* avoid mnexto()/MON_AT() problem */
		mtmp->wormno = num_segs;
		mtmp->mlstmv = moves;
		mtmp->nmon = mydogs;
		mydogs = mtmp;
	    } else if (mtmp->iswiz) {
		/* we want to be able to find him when his next resurrection
		   chance comes up, but have him resume his present location
		   if player returns to this level before that time */
		migrate_to_level(mtmp, ledger_no(&u.uz),
				 MIGR_EXACT_XY, NULL);
	    } else if (mtmp->mleashed) {
		/* this can happen if your quest leader ejects you from the
		   "home" level while a leashed pet isn't next to you */
		pline("%s leash goes slack.", s_suffix(Monnam(mtmp)));
		m_unleash(mtmp, FALSE);
	    }
	}
}